

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_201151b::BIP32PubkeyProvider::GetPrivKey
          (BIP32PubkeyProvider *this,int pos,SigningProvider *arg,CKey *key)

{
  bool bVar1;
  DeriveType DVar2;
  long in_FS_OFFSET;
  CExtKey dummy;
  CExtKey extkey;
  CExtKey local_b0;
  CExtKey local_70;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_70.chaincode.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_70.key.fCompressed = false;
  local_70.key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_b0.key.fCompressed = false;
  local_b0.key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  bVar1 = GetDerivedExtKey(this,arg,&local_70,&local_b0);
  if (bVar1) {
    DVar2 = this->m_derive;
    if (DVar2 == UNHARDENED) {
      bVar1 = CExtKey::Derive(&local_70,&local_70,pos);
      if (!bVar1) goto LAB_005b8082;
      DVar2 = this->m_derive;
    }
    if (DVar2 == HARDENED) {
      bVar1 = CExtKey::Derive(&local_70,&local_70,pos | 0x80000000);
      if (!bVar1) goto LAB_005b8082;
    }
    bVar1 = true;
    CKey::operator=(key,&local_70.key);
  }
  else {
LAB_005b8082:
    bVar1 = false;
  }
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_b0.key.keydata);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_70.key.keydata);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool GetPrivKey(int pos, const SigningProvider& arg, CKey& key) const override
    {
        CExtKey extkey;
        CExtKey dummy;
        if (!GetDerivedExtKey(arg, extkey, dummy)) return false;
        if (m_derive == DeriveType::UNHARDENED && !extkey.Derive(extkey, pos)) return false;
        if (m_derive == DeriveType::HARDENED && !extkey.Derive(extkey, pos | 0x80000000UL)) return false;
        key = extkey.key;
        return true;
    }